

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator::GenerateBuilderMembers
          (ImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  JavaType JVar2;
  long in_RDI;
  JavaType type;
  char *in_stack_00000028;
  Printer *in_stack_00000030;
  FieldDescriptor *in_stack_00000038;
  bool in_stack_000000a3;
  FieldAccessorType in_stack_000000a4;
  FieldDescriptor *in_stack_000000a8;
  Printer *in_stack_000000b0;
  char *in_stack_000001c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001c8;
  Printer *in_stack_000001d0;
  
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
  bVar1 = SupportFieldPresence((FileDescriptor *)0x597343);
  if (bVar1) {
    WriteFieldAccessorDocComment
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
    io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  }
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  WriteFieldAccessorDocComment
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_000000a3);
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000030,in_stack_00000028,(char *)this,(FieldDescriptor *)printer);
  JVar2 = GetJavaType(in_stack_00000038);
  if ((JVar2 == JAVATYPE_STRING) || (JVar2 == JAVATYPE_BYTES)) {
    io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  }
  else {
    io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  }
  io::Printer::Print(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0);
  return;
}

Assistant:

void ImmutablePrimitiveFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  printer->Print(variables_, "private $field_type$ $name$_ $default_init$;\n");

  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
    printer->Print(
        variables_,
        "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
        "  return $get_has_field_bit_builder$;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  return $name$_;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$set$capitalized_name$$}$($type$ value) {\n"
                 "$null_check$"
                 "  $set_has_field_bit_builder$\n"
                 "  $name$_ = value;\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  $clear_has_field_bit_builder$\n");
  printer->Annotate("{", "}", descriptor_);
  JavaType type = GetJavaType(descriptor_);
  if (type == JAVATYPE_STRING || type == JAVATYPE_BYTES) {
    // The default value is not a simple literal so we want to avoid executing
    // it multiple times.  Instead, get the default out of the default instance.
    printer->Print(
        variables_,
        "  $name$_ = getDefaultInstance().get$capitalized_name$();\n");
  } else {
    printer->Print(variables_, "  $name$_ = $default$;\n");
  }
  printer->Print(variables_,
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
}